

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcVertexPoint::IfcVertexPoint(IfcVertexPoint *this)

{
  *(undefined ***)&this->field_0x48 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x50 = 0;
  *(char **)&this->field_0x58 = "IfcVertexPoint";
  IfcVertex::IfcVertex(&this->super_IfcVertex,&PTR_construction_vtable_24__0080f2f0);
  *(undefined8 *)&(this->super_IfcVertex).field_0x38 = 0;
  *(undefined8 *)&(this->super_IfcVertex).field_0x40 = 0;
  (this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x80f238;
  *(undefined8 *)&this->field_0x48 = 0x80f2d8;
  *(undefined8 *)
   &(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x80f260;
  *(undefined8 *)
   &(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x80f288;
  *(undefined8 *)&(this->super_IfcVertex).super_IfcTopologicalRepresentationItem.field_0x30 =
       0x80f2b0;
  return;
}

Assistant:

IfcVertexPoint() : Object("IfcVertexPoint") {}